

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_test_class.cpp
# Opt level: O1

void __thiscall test_test::test_char_neq_compare::test_method(test_char_neq_compare *this)

{
  int iVar1;
  ne_impl local_109;
  char (*local_108) [6];
  char (*local_100) [6];
  assertion_result local_f8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined1 *local_d0;
  char (**local_c8) [6];
  undefined **local_c0;
  ulong local_b8;
  shared_count sStack_b0;
  char (**local_a8) [6];
  lazy_ostream local_a0;
  undefined1 *local_90;
  char *local_88;
  const_string local_80;
  char rcca2 [6];
  char lcca2 [6];
  char rca1 [6];
  char lca1 [6];
  char *rccpc4;
  char *lccpc4;
  char *rccp3;
  char *lccp3;
  
  builtin_strncpy(lca1,"Hello",6);
  builtin_strncpy(rca1,"World",6);
  builtin_strncpy(lcca2,"Hello",6);
  builtin_strncpy(rcca2,"World",6);
  lccp3 = "Hello";
  rccp3 = "World";
  lccpc4 = "Hello";
  rccpc4 = "World";
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x6f;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  local_c0 = (undefined **)((ulong)local_c0 & 0xffffffffffffff00);
  local_b8 = 0;
  sStack_b0.pi_ = (sp_counted_base *)0x0;
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count(&sStack_b0);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_a8 = &local_100;
  local_100 = (char (*) [6])0x1588d2;
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = (char (*) [6])0x1588cc;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x6f,CHECK,CHECK_NE,2,"\"Hello\"",&local_c0,"\"World\"",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x70;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  local_c0 = (undefined **)CONCAT71(local_c0._1_7_,rca1._4_2_ == 0x6f && rca1._0_4_ == 0x6c6c6548);
  local_b8 = 0;
  sStack_b0.pi_ = (sp_counted_base *)0x0;
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(rca1._4_2_ != 0x6f || rca1._0_4_ != 0x6c6c6548);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count(&sStack_b0);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_100 = (char (*) [6])0x1588d2;
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = &rca1;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x70,CHECK,CHECK_NE,2,"\"Hello\"",&local_c0,"rca1",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x71;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_c0 = (undefined **)CONCAT71(local_c0._1_7_,rcca2._4_2_ == 0x6f && rcca2._0_4_ == 0x6c6c6548)
  ;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  local_b8 = 0;
  sStack_b0.pi_ = (sp_counted_base *)0x0;
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(rcca2._4_2_ != 0x6f || rcca2._0_4_ != 0x6c6c6548);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count(&sStack_b0);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_100 = (char (*) [6])0x1588d2;
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = &rcca2;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x71,CHECK,CHECK_NE,2,"\"Hello\"",&local_c0,"rcca2",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x72;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()
            (&local_f8,&local_109,(char (*) [6])"Hello",&rccp3);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_100 = (char (*) [6])0x1588d2;
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bd30;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = (char (*) [6])&rccp3;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x72,CHECK,CHECK_NE,2,"\"Hello\"",&local_c0,"rccp3",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x73;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()
            (&local_f8,&local_109,(char (*) [6])"Hello",&rccpc4);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_100 = (char (*) [6])0x1588d2;
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bd30;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = (char (*) [6])&rccpc4;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x73,CHECK,CHECK_NE,2,"\"Hello\"",&local_c0,"rccpc4",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x75;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_c0 = (undefined **)CONCAT71(local_c0._1_7_,lca1._4_2_ == 100 && lca1._0_4_ == 0x6c726f57);
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  local_b8 = 0;
  sStack_b0.pi_ = (sp_counted_base *)0x0;
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(lca1._4_2_ != 100 || lca1._0_4_ != 0x6c726f57);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count(&sStack_b0);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = (char (*) [6])0x1588cc;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_100 = &lca1;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x75,CHECK,CHECK_NE,2,"lca1",&local_c0,"\"World\"",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x76;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  iVar1 = strcmp(lca1,rca1);
  local_c0 = (undefined **)CONCAT71(local_c0._1_7_,iVar1 == 0);
  local_b8 = 0;
  sStack_b0.pi_ = (sp_counted_base *)0x0;
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 != 0);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count(&sStack_b0);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = &rca1;
  local_100 = &lca1;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x76,CHECK,CHECK_NE,2,"lca1",&local_c0,"rca1",&local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x77;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  iVar1 = strcmp(lca1,rcca2);
  local_c0 = (undefined **)CONCAT71(local_c0._1_7_,iVar1 == 0);
  local_b8 = 0;
  sStack_b0.pi_ = (sp_counted_base *)0x0;
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 != 0);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count(&sStack_b0);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_108 = &rcca2;
  local_100 = &lca1;
  local_c8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x77,CHECK,CHECK_NE,2,"lca1",&local_c0,"rcca2",&local_e0)
  ;
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x78;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()(&local_f8,&local_109,&lca1,&rccp3);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bd30;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_108 = (char (*) [6])&rccp3;
  local_100 = &lca1;
  local_c8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x78,CHECK,CHECK_NE,2,"lca1",&local_c0,"rccp3",&local_e0)
  ;
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x79;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()(&local_f8,&local_109,&lca1,&rccpc4);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bd30;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_108 = (char (*) [6])&rccpc4;
  local_100 = &lca1;
  local_c8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x79,CHECK,CHECK_NE,2,"lca1",&local_c0,"rccpc4",&local_e0
            );
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x7b;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_c0 = (undefined **)CONCAT71(local_c0._1_7_,lcca2._4_2_ == 100 && lcca2._0_4_ == 0x6c726f57);
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  local_b8 = 0;
  sStack_b0.pi_ = (sp_counted_base *)0x0;
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(lcca2._4_2_ != 100 || lcca2._0_4_ != 0x6c726f57);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count(&sStack_b0);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = (char (*) [6])0x1588cc;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_100 = &lcca2;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x7b,CHECK,CHECK_NE,2,"lcca2",&local_c0,"\"World\"",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x7c;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  iVar1 = strcmp(lcca2,rca1);
  local_c0 = (undefined **)CONCAT71(local_c0._1_7_,iVar1 == 0);
  local_b8 = 0;
  sStack_b0.pi_ = (sp_counted_base *)0x0;
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 != 0);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count(&sStack_b0);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = &rca1;
  local_100 = &lcca2;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x7c,CHECK,CHECK_NE,2,"lcca2",&local_c0,"rca1",&local_e0)
  ;
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x7d;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  iVar1 = strcmp(lcca2,rcca2);
  local_c0 = (undefined **)CONCAT71(local_c0._1_7_,iVar1 == 0);
  local_b8 = 0;
  sStack_b0.pi_ = (sp_counted_base *)0x0;
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 != 0);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count(&sStack_b0);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = &rcca2;
  local_100 = &lcca2;
  local_a8 = &local_100;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x7d,CHECK,CHECK_NE,2,"lcca2",&local_c0,"rcca2",&local_e0
            );
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x7e;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()(&local_f8,&local_109,&lcca2,&rccp3);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bd30;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = (char (*) [6])&rccp3;
  local_100 = &lcca2;
  local_a8 = &local_100;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x7e,CHECK,CHECK_NE,2,"lcca2",&local_c0,"rccp3",&local_e0
            );
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x7f;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()(&local_f8,&local_109,&lcca2,&rccpc4);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bcf0;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bd30;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = (char (*) [6])&rccpc4;
  local_100 = &lcca2;
  local_a8 = &local_100;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x7f,CHECK,CHECK_NE,2,"lcca2",&local_c0,"rccpc4",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x81;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()
            (&local_f8,&local_109,&lccp3,(char (*) [6])"World");
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_108 = (char (*) [6])0x1588cc;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_100 = (char (*) [6])&lccp3;
  local_a8 = &local_100;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x81,CHECK,CHECK_NE,2,"lccp3",&local_c0,"\"World\"",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x82;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()(&local_f8,&local_109,&lccp3,&rca1);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = &rca1;
  local_100 = (char (*) [6])&lccp3;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x82,CHECK,CHECK_NE,2,"lccp3",&local_c0,"rca1",&local_e0)
  ;
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x83;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()(&local_f8,&local_109,&lccp3,&rcca2);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = &rcca2;
  local_100 = (char (*) [6])&lccp3;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x83,CHECK,CHECK_NE,2,"lccp3",&local_c0,"rcca2",&local_e0
            );
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x84;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()(&local_f8,&local_109,&lccp3,&rccp3);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bd30;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = (char (*) [6])&rccp3;
  local_100 = (char (*) [6])&lccp3;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x84,CHECK,CHECK_NE,2,"lccp3",&local_c0,"rccp3",&local_e0
            );
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x85;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()(&local_f8,&local_109,&lccp3,&rccpc4);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bd30;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = (char (*) [6])&rccpc4;
  local_100 = (char (*) [6])&lccp3;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x85,CHECK,CHECK_NE,2,"lccp3",&local_c0,"rccpc4",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x87;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()
            (&local_f8,&local_109,&lccpc4,(char (*) [6])"World");
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = (char (*) [6])0x1588cc;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_100 = (char (*) [6])&lccpc4;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x87,CHECK,CHECK_NE,2,"lccpc4",&local_c0,"\"World\"",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x88;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()(&local_f8,&local_109,&lccpc4,&rca1);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = &rca1;
  local_100 = (char (*) [6])&lccpc4;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x88,CHECK,CHECK_NE,2,"lccpc4",&local_c0,"rca1",&local_e0
            );
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x89;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()(&local_f8,&local_109,&lccpc4,&rcca2);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bcf0;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = &rcca2;
  local_100 = (char (*) [6])&lccpc4;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x89,CHECK,CHECK_NE,2,"lccpc4",&local_c0,"rcca2",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x8a;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()(&local_f8,&local_109,&lccpc4,&rccp3);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bd30;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = (char (*) [6])&rccp3;
  local_100 = (char (*) [6])&lccpc4;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x8a,CHECK,CHECK_NE,2,"lccpc4",&local_c0,"rccp3",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x8b;
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017bc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  boost::test_tools::tt_detail::ne_impl::operator()(&local_f8,&local_109,&lccpc4,&rccpc4);
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_80.m_end = "";
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_c0 = &PTR__lazy_ostream_0017bd30;
  sStack_b0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0017bd30;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_108 = (char (*) [6])&rccpc4;
  local_100 = (char (*) [6])&lccpc4;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_a0,&local_80,0x8b,CHECK,CHECK_NE,2,"lccpc4",&local_c0,"rccpc4",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_char_neq_compare)
{
    char lca1[] = "Hello";
    char rca1[] = "World";
    const char lcca2[] = "Hello", rcca2[] = "World";
    const char *lccp3 = "Hello";
    const char *rccp3 = "World";
    const char * const lccpc4 = "Hello";
    const char * const rccpc4 = "World";

    BOOST_CHECK_NE("Hello", "World");
    BOOST_CHECK_NE("Hello", rca1);
    BOOST_CHECK_NE("Hello", rcca2);
    BOOST_CHECK_NE("Hello", rccp3);
    BOOST_CHECK_NE("Hello", rccpc4);

    BOOST_CHECK_NE(lca1, "World");
    BOOST_CHECK_NE(lca1, rca1);
    BOOST_CHECK_NE(lca1, rcca2);
    BOOST_CHECK_NE(lca1, rccp3);
    BOOST_CHECK_NE(lca1, rccpc4);

    BOOST_CHECK_NE(lcca2, "World");
    BOOST_CHECK_NE(lcca2, rca1);
    BOOST_CHECK_NE(lcca2, rcca2);
    BOOST_CHECK_NE(lcca2, rccp3);
    BOOST_CHECK_NE(lcca2, rccpc4);

    BOOST_CHECK_NE(lccp3, "World");
    BOOST_CHECK_NE(lccp3, rca1);
    BOOST_CHECK_NE(lccp3, rcca2);
    BOOST_CHECK_NE(lccp3, rccp3);
    BOOST_CHECK_NE(lccp3, rccpc4);

    BOOST_CHECK_NE(lccpc4, "World");
    BOOST_CHECK_NE(lccpc4, rca1);
    BOOST_CHECK_NE(lccpc4, rcca2);
    BOOST_CHECK_NE(lccpc4, rccp3);
    BOOST_CHECK_NE(lccpc4, rccpc4);
}